

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>_>_>
::destroy_slots(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>_>_>
                *this)

{
  bool bVar1;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>_>_>
  *this_local;
  
  bVar1 = is_soo(this);
  if (bVar1) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe46,
                  "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>>>::destroy_slots() [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>, Hash = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>>]"
                 );
  }
  return;
}

Assistant:

inline void destroy_slots() {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    if (PolicyTraits::template destroy_is_trivial<Alloc>()) return;
    IterateOverFullSlots(
        common(), slot_array(),
        [&](const ctrl_t*, slot_type* slot)
            ABSL_ATTRIBUTE_ALWAYS_INLINE { this->destroy(slot); });
  }